

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat.h
# Opt level: O0

bool __thiscall
wasm::analysis::Flat<unsigned_int>::join(Flat<unsigned_int> *this,Element *joinee,Element *joiner)

{
  LatticeComparison LVar1;
  Top local_31;
  undefined4 local_30;
  __index_type local_2c;
  Element *local_28;
  Element *joiner_local;
  Element *joinee_local;
  Flat<unsigned_int> *this_local;
  
  local_28 = joiner;
  joiner_local = joinee;
  joinee_local = (Element *)this;
  LVar1 = compare(this,joinee,joiner);
  switch(LVar1) {
  case NO_RELATION:
    std::
    variant<wasm::analysis::Flat<unsigned_int>::Bot,unsigned_int,wasm::analysis::Flat<unsigned_int>::Top>
    ::
    variant<wasm::analysis::Flat<unsigned_int>::Top,void,void,wasm::analysis::Flat<unsigned_int>::Top,void>
              ((variant<wasm::analysis::Flat<unsigned_int>::Bot,unsigned_int,wasm::analysis::Flat<unsigned_int>::Top>
                *)&local_30,&local_31);
    (joiner_local->
    super_variant<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
    ).
    super__Variant_base<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
    .
    super__Move_assign_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
    .
    super__Copy_assign_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
    .
    super__Move_ctor_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
    .
    super__Copy_ctor_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
    .
    super__Variant_storage_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
    ._M_u = local_30;
    *(__index_type *)
     ((long)&(joiner_local->
             super_variant<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
             ).
             super__Variant_base<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
             .
             super__Move_assign_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
             .
             super__Copy_assign_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
             .
             super__Move_ctor_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
             .
             super__Copy_ctor_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
             .
             super__Variant_storage_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
     + 4) = local_2c;
    this_local._7_1_ = true;
    break;
  case EQUAL:
  case GREATER:
    this_local._7_1_ = false;
    break;
  case LESS:
    (joiner_local->
    super_variant<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
    ).
    super__Variant_base<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
    .
    super__Move_assign_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
    .
    super__Copy_assign_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
    .
    super__Move_ctor_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
    .
    super__Copy_ctor_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
    .
    super__Variant_storage_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
    ._M_u = (local_28->
            super_variant<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
            ).
            super__Variant_base<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
            .
            super__Move_assign_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
            .
            super__Copy_assign_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
            .
            super__Move_ctor_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
            .
            super__Copy_ctor_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
            .
            super__Variant_storage_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
            ._M_u;
    *(__index_type *)
     ((long)&(joiner_local->
             super_variant<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
             ).
             super__Variant_base<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
             .
             super__Move_assign_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
             .
             super__Copy_assign_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
             .
             super__Move_ctor_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
             .
             super__Copy_ctor_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
             .
             super__Variant_storage_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
     + 4) = *(__index_type *)
             ((long)&(local_28->
                     super_variant<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                     ).
                     super__Variant_base<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                     .
                     super__Move_assign_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                     .
                     super__Copy_assign_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                     .
                     super__Move_ctor_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                     .
                     super__Copy_ctor_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                     .
                     super__Variant_storage_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
             + 4);
    this_local._7_1_ = true;
    break;
  default:
    wasm::handle_unreachable
              ("unexpected comparison result",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/analysis/lattices/flat.h"
               ,0x5b);
  }
  return this_local._7_1_;
}

Assistant:

bool join(Element& joinee, const Element& joiner) const noexcept {
    switch (compare(joinee, joiner)) {
      case LESS:
        joinee = joiner;
        return true;
      case NO_RELATION:
        joinee = Element{Top{}};
        return true;
      case GREATER:
      case EQUAL:
        return false;
    }
    WASM_UNREACHABLE("unexpected comparison result");
  }